

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

void __thiscall indigox::Bond::Bond(Bond *this,Atom_p *a,Atom_p *b)

{
  uid_t uVar1;
  array<std::weak_ptr<indigox::Atom>,_2UL> *in_RDX;
  array<std::weak_ptr<indigox::Atom>,_2UL> *in_RSI;
  CountableObject<indigox::Bond> *in_RDI;
  shared_ptr<indigox::Atom> *__r;
  
  utils::CountableObject<indigox::Bond>::CountableObject(in_RDI);
  std::enable_shared_from_this<indigox::Bond>::enable_shared_from_this
            ((enable_shared_from_this<indigox::Bond> *)0x10e003);
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::array(in_RDX);
  __r = (shared_ptr<indigox::Atom> *)(in_RDI + 7);
  in_RDI[7].id_ = 0;
  in_RDI[8].id_ = 0;
  std::weak_ptr<indigox::Molecule>::weak_ptr((weak_ptr<indigox::Molecule> *)0x10e032);
  *(undefined4 *)&in_RDI[9].id_ = 8;
  std::weak_ptr<indigox::Atom>::weak_ptr<indigox::Atom,void>(in_RSI->_M_elems,__r);
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[](in_RSI,(size_type)__r);
  std::weak_ptr<indigox::Atom>::operator=(in_RSI->_M_elems,(weak_ptr<indigox::Atom> *)__r);
  std::weak_ptr<indigox::Atom>::~weak_ptr((weak_ptr<indigox::Atom> *)0x10e077);
  std::weak_ptr<indigox::Atom>::weak_ptr<indigox::Atom,void>(in_RSI->_M_elems,__r);
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[](in_RSI,(size_type)__r);
  std::weak_ptr<indigox::Atom>::operator=(in_RSI->_M_elems,(weak_ptr<indigox::Atom> *)__r);
  std::weak_ptr<indigox::Atom>::~weak_ptr((weak_ptr<indigox::Atom> *)0x10e0b1);
  uVar1 = utils::CountableObject<indigox::Bond>::GetUniqueID(in_RDI);
  in_RDI[10].id_ = uVar1;
  return;
}

Assistant:

Bond::Bond(Atom_p a, Atom_p b) : utils::CountableObject<Bond>(), mol_() {
    atoms_[0] = Atom_wp(a);
    atoms_[1] = Atom_wp(b);
    idx_ = GetUniqueID();
  }